

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVST2LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int iVar2;
  DecodeStatus DVar3;
  uint *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t extraout_RDX_01;
  uint uVar4;
  uint RegNo;
  uint uVar5;
  DecodeStatus local_38;
  
  local_38 = MCDisassembler_Fail;
  Decoder_00 = &switchD_0015206b::switchdataD_001cbfd0;
  switch(Insn >> 10 & 3) {
  case 0:
    uVar4 = Insn >> 5 & 7;
    uVar5 = Insn >> 3 & 2;
    iVar2 = 1;
    goto LAB_001520d1;
  case 1:
    uVar4 = Insn >> 6 & 3;
    uVar5 = Insn >> 2 & 4;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    uVar4 = Insn >> 7 & 1;
    uVar5 = Insn >> 1 & 8;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    goto switchD_0015206b_caseD_3;
  }
  iVar2 = 2 - (uint)(uVar1 == 0);
LAB_001520d1:
  uVar1 = Insn >> 0x10 & 0xf;
  RegNo = Insn & 0xf;
  if (RegNo == 0xf) {
    local_38 = MCDisassembler_Success;
LAB_00152107:
    DVar3 = DecodeGPRRegisterClass(Inst,uVar1,Address,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) goto LAB_001521a3;
      local_38 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar5);
    Address_01 = Address_00;
    if (RegNo != 0xf) {
      if (RegNo == 0xd) {
        MCOperand_CreateReg0(Inst,0);
        Address_01 = extraout_RDX_00;
      }
      else {
        DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
        Address_01 = extraout_RDX_01;
        if (DVar3 != MCDisassembler_Success) {
          if (DVar3 != MCDisassembler_SoftFail) {
            return MCDisassembler_Fail;
          }
          local_38 = MCDisassembler_SoftFail;
        }
      }
    }
    uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
    DVar3 = DecodeDPRRegisterClass(Inst,uVar1,Address_01,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_38 = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeDPRRegisterClass(Inst,iVar2 + uVar1,Address_02,Decoder_00);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_38 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
  }
  else {
    local_38 = DecodeGPRRegisterClass(Inst,uVar1,Address,&switchD_0015206b::switchdataD_001cbfd0);
    Decoder_00 = (uint *)(ulong)(local_38 | 2);
    Address = extraout_RDX;
    if ((local_38 | 2) == MCDisassembler_Success) goto LAB_00152107;
LAB_001521a3:
    local_38 = MCDisassembler_Fail;
  }
switchD_0015206b_caseD_3:
  return local_38;
}

Assistant:

static DecodeStatus DecodeVST2LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			index = fieldFromInstruction_4(Insn, 5, 3);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 1:
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 4, 1) != 0)
				align = 8;
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}